

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetSigningProvider
          (DescriptorScriptPubKeyMan *this,int32_t index,bool include_private)

{
  element_type *peVar1;
  _Head_base<0UL,_FlatSigningProvider_*,_false> _Var2;
  int iVar3;
  iterator iVar4;
  mapped_type *this_00;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  DescriptorScriptPubKeyMan *this_01;
  long in_FS_OFFSET;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> out_keys;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  _Head_base<0UL,_FlatSigningProvider_*,_false> local_178;
  uint local_16c;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_168;
  undefined1 local_138 [16];
  pointer local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  size_t local_108;
  _Rb_tree_node_base local_f8;
  size_t local_d8;
  _Rb_tree_node_base local_c8;
  size_t local_a8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_a0;
  _Rb_tree_node_base local_68;
  size_t local_48;
  long local_38;
  
  this_01 = (DescriptorScriptPubKeyMan *)CONCAT44(in_register_00000034,index);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_16c = (uint)CONCAT71(in_register_00000011,include_private);
  std::make_unique<FlatSigningProvider>();
  iVar4 = std::
          _Rb_tree<int,_std::pair<const_int,_FlatSigningProvider>,_std::_Select1st<std::pair<const_int,_FlatSigningProvider>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
          ::find(&(this_01->m_map_signing_providers)._M_t,(key_type_conflict2 *)&local_16c);
  _Var2._M_head_impl = local_178._M_head_impl;
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this_01->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header) {
    local_138._0_8_ = (_func_int **)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_128 = (pointer)0x0;
    peVar1 = (this_01->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar1->_vptr_Descriptor[9])
                      (peVar1,(ulong)local_16c,&(this_01->m_wallet_descriptor).cache,local_138,
                       local_178._M_head_impl);
    _Var2._M_head_impl = local_178._M_head_impl;
    if ((char)iVar3 == '\0') {
      (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
    }
    else {
      this_00 = std::
                map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
                ::operator[](&this_01->m_map_signing_providers,(key_type_conflict2 *)&local_16c);
      FlatSigningProvider::operator=(this_00,_Var2._M_head_impl);
    }
    std::vector<CScript,_std::allocator<CScript>_>::~vector
              ((vector<CScript,_std::allocator<CScript>_> *)local_138);
    if ((char)iVar3 == '\0') goto LAB_004276f4;
  }
  else {
    FlatSigningProvider::FlatSigningProvider
              ((FlatSigningProvider *)local_138,(FlatSigningProvider *)&iVar4._M_node[1]._M_parent);
    FlatSigningProvider::Merge(_Var2._M_head_impl,(FlatSigningProvider *)local_138);
    FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)local_138);
  }
  iVar3 = (*(this_01->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0xf])(this_01);
  if (((byte)iVar3 & in_CL) == 1) {
    local_118 = (_Base_ptr)&local_128;
    local_138._0_8_ = &PTR__FlatSigningProvider_00a1ca50;
    local_128 = (pointer)((ulong)local_128 & 0xffffffff00000000);
    local_120 = (_Base_ptr)0x0;
    local_108 = 0;
    local_f8._M_left = &local_f8;
    local_f8._M_color = _S_red;
    local_f8._M_parent = (_Base_ptr)0x0;
    local_d8 = 0;
    local_c8._M_left = &local_c8;
    local_c8._M_color = _S_red;
    local_c8._M_parent = (_Base_ptr)0x0;
    local_a8 = 0;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0._M_impl.super__Rb_tree_header._M_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_left = &local_68;
    local_68._M_color = _S_red;
    local_68._M_parent = (_Base_ptr)0x0;
    local_48 = 0;
    local_110 = local_118;
    local_f8._M_right = local_f8._M_left;
    local_c8._M_right = local_c8._M_left;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68._M_right = local_68._M_left;
    GetKeys((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *
            )&local_168,this_01);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::operator=(&local_a0,&local_168);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_168);
    peVar1 = (this_01->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_Descriptor[10])(peVar1,(ulong)local_16c,local_138,local_178._M_head_impl);
    FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)local_138);
  }
  (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)local_178._M_head_impl;
  local_178._M_head_impl = (FlatSigningProvider *)0x0;
LAB_004276f4:
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
            ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
             &local_178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
            )(__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<FlatSigningProvider> DescriptorScriptPubKeyMan::GetSigningProvider(int32_t index, bool include_private) const
{
    AssertLockHeld(cs_desc_man);

    std::unique_ptr<FlatSigningProvider> out_keys = std::make_unique<FlatSigningProvider>();

    // Fetch SigningProvider from cache to avoid re-deriving
    auto it = m_map_signing_providers.find(index);
    if (it != m_map_signing_providers.end()) {
        out_keys->Merge(FlatSigningProvider{it->second});
    } else {
        // Get the scripts, keys, and key origins for this script
        std::vector<CScript> scripts_temp;
        if (!m_wallet_descriptor.descriptor->ExpandFromCache(index, m_wallet_descriptor.cache, scripts_temp, *out_keys)) return nullptr;

        // Cache SigningProvider so we don't need to re-derive if we need this SigningProvider again
        m_map_signing_providers[index] = *out_keys;
    }

    if (HavePrivateKeys() && include_private) {
        FlatSigningProvider master_provider;
        master_provider.keys = GetKeys();
        m_wallet_descriptor.descriptor->ExpandPrivate(index, master_provider, *out_keys);
    }

    return out_keys;
}